

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_8::ComputeRegisterLiveness::ComputeRegisterLiveness
          (ComputeRegisterLiveness *this,RegisterLiveness *reg_pressure,Function *f)

{
  IRContext *pIVar1;
  CFG *pCVar2;
  DefUseManager *pDVar3;
  DominatorAnalysis *this_00;
  DominatorTree *pDVar4;
  LoopDescriptor *pLVar5;
  Function *f_local;
  RegisterLiveness *reg_pressure_local;
  ComputeRegisterLiveness *this_local;
  
  this->reg_pressure_ = reg_pressure;
  pIVar1 = RegisterLiveness::GetContext(reg_pressure);
  this->context_ = pIVar1;
  this->function_ = f;
  pIVar1 = RegisterLiveness::GetContext(reg_pressure);
  pCVar2 = IRContext::cfg(pIVar1);
  this->cfg_ = pCVar2;
  pIVar1 = RegisterLiveness::GetContext(reg_pressure);
  pDVar3 = IRContext::get_def_use_mgr(pIVar1);
  this->def_use_manager_ = pDVar3;
  pIVar1 = RegisterLiveness::GetContext(reg_pressure);
  this_00 = IRContext::GetDominatorAnalysis(pIVar1,f);
  pDVar4 = DominatorAnalysisBase::GetDomTree(&this_00->super_DominatorAnalysisBase);
  this->dom_tree_ = pDVar4;
  pIVar1 = RegisterLiveness::GetContext(reg_pressure);
  pLVar5 = IRContext::GetLoopDescriptor(pIVar1,f);
  this->loop_desc_ = pLVar5;
  return;
}

Assistant:

ComputeRegisterLiveness(RegisterLiveness* reg_pressure, Function* f)
      : reg_pressure_(reg_pressure),
        context_(reg_pressure->GetContext()),
        function_(f),
        cfg_(*reg_pressure->GetContext()->cfg()),
        def_use_manager_(*reg_pressure->GetContext()->get_def_use_mgr()),
        dom_tree_(
            reg_pressure->GetContext()->GetDominatorAnalysis(f)->GetDomTree()),
        loop_desc_(*reg_pressure->GetContext()->GetLoopDescriptor(f)) {}